

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O0

Gia_Man_t * Gia_ManInsertWin(Gia_Man_t *p,Vec_Int_t *vOuts,Gia_Man_t *pWin)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Gia_Man_t *pGVar8;
  bool bVar9;
  int local_54;
  Gia_Obj_t *pGStack_50;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vAnds;
  Vec_Int_t *vPis;
  Vec_Int_t *vPos;
  Gia_Man_t *pWin_local;
  Vec_Int_t *vOuts_local;
  Gia_Man_t *p_local;
  
  vPos = (Vec_Int_t *)pWin;
  pWin_local = (Gia_Man_t *)vOuts;
  vOuts_local = (Vec_Int_t *)p;
  Gia_ManPrepareWin(p,vOuts,&vAnds,&vPis,(Vec_Int_t **)&pNew,0);
  iVar2 = Gia_ManObjNum((Gia_Man_t *)vOuts_local);
  iVar3 = Vec_IntSize((Vec_Int_t *)pNew);
  iVar4 = Gia_ManAndNum((Gia_Man_t *)vPos);
  p_00 = Gia_ManStart((iVar2 - iVar3) + iVar4);
  pcVar6 = Abc_UtilStrsav(*(char **)vOuts_local);
  p_00->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav((char *)vOuts_local->pArray);
  p_00->pSpec = pcVar6;
  pGVar7 = Gia_ManConst0((Gia_Man_t *)vOuts_local);
  pGVar7->Value = 0;
  local_54 = 0;
  while( true ) {
    iVar2 = Vec_IntSize(*(Vec_Int_t **)(vOuts_local + 4));
    bVar9 = false;
    if (local_54 < iVar2) {
      pGStack_50 = Gia_ManCi((Gia_Man_t *)vOuts_local,local_54);
      bVar9 = pGStack_50 != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    uVar5 = Gia_ManAppendCi(p_00);
    pGStack_50->Value = uVar5;
    local_54 = local_54 + 1;
  }
  pGVar7 = Gia_ManConst0((Gia_Man_t *)vPos);
  pGVar7->Value = 0;
  local_54 = 0;
  while( true ) {
    iVar2 = Vec_IntSize(*(Vec_Int_t **)(vPos + 4));
    bVar9 = false;
    if (local_54 < iVar2) {
      pGStack_50 = Gia_ManCi((Gia_Man_t *)vPos,local_54);
      bVar9 = pGStack_50 != (Gia_Obj_t *)0x0;
    }
    pVVar1 = vOuts_local;
    if (!bVar9) break;
    iVar2 = Vec_IntEntry(vAnds,local_54);
    pGVar7 = Gia_ManObj((Gia_Man_t *)pVVar1,iVar2);
    pGStack_50->Value = pGVar7->Value;
    local_54 = local_54 + 1;
  }
  Gia_ManHashAlloc(p_00);
  local_54 = 0;
  while( true ) {
    bVar9 = false;
    if (local_54 < *(int *)&vPos[1].pArray) {
      pGStack_50 = Gia_ManObj((Gia_Man_t *)vPos,local_54);
      bVar9 = pGStack_50 != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    iVar2 = Gia_ObjIsAnd(pGStack_50);
    if (iVar2 != 0) {
      iVar2 = Gia_ObjFanin0Copy(pGStack_50);
      iVar3 = Gia_ObjFanin1Copy(pGStack_50);
      uVar5 = Gia_ManHashAnd(p_00,iVar2,iVar3);
      pGStack_50->Value = uVar5;
    }
    local_54 = local_54 + 1;
  }
  local_54 = 0;
  while( true ) {
    iVar2 = Vec_IntSize((Vec_Int_t *)vPos[4].pArray);
    bVar9 = false;
    if (local_54 < iVar2) {
      pGStack_50 = Gia_ManCo((Gia_Man_t *)vPos,local_54);
      bVar9 = pGStack_50 != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    uVar5 = Gia_ObjFanin0Copy(pGStack_50);
    pVVar1 = vOuts_local;
    iVar2 = Vec_IntEntry(vPis,local_54);
    pGVar7 = Gia_ManObj((Gia_Man_t *)pVVar1,iVar2);
    pGVar7->Value = uVar5;
    local_54 = local_54 + 1;
  }
  local_54 = 0;
  while( true ) {
    bVar9 = false;
    if (local_54 < *(int *)&vOuts_local[1].pArray) {
      pGStack_50 = Gia_ManObj((Gia_Man_t *)vOuts_local,local_54);
      bVar9 = pGStack_50 != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    iVar2 = Gia_ObjIsAnd(pGStack_50);
    if ((iVar2 != 0) &&
       (iVar2 = Gia_ObjIsTravIdCurrentId((Gia_Man_t *)vOuts_local,local_54), iVar2 == 0)) {
      iVar2 = Gia_ObjFanin0Copy(pGStack_50);
      iVar3 = Gia_ObjFanin1Copy(pGStack_50);
      uVar5 = Gia_ManHashAnd(p_00,iVar2,iVar3);
      pGStack_50->Value = uVar5;
    }
    local_54 = local_54 + 1;
  }
  local_54 = 0;
  while( true ) {
    iVar2 = Vec_IntSize((Vec_Int_t *)vOuts_local[4].pArray);
    bVar9 = false;
    if (local_54 < iVar2) {
      pGStack_50 = Gia_ManCo((Gia_Man_t *)vOuts_local,local_54);
      bVar9 = pGStack_50 != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    iVar2 = Gia_ObjFanin0Copy(pGStack_50);
    Gia_ManAppendCo(p_00,iVar2);
    local_54 = local_54 + 1;
  }
  Gia_ManHashStop(p_00);
  Vec_IntFree(vAnds);
  Vec_IntFree(vPis);
  Vec_IntFree((Vec_Int_t *)pNew);
  pGVar8 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar8;
}

Assistant:

Gia_Man_t * Gia_ManInsertWin( Gia_Man_t * p, Vec_Int_t * vOuts, Gia_Man_t * pWin )
{
    Vec_Int_t * vPos, * vPis, * vAnds;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManPrepareWin( p, vOuts, &vPis, &vPos, &vAnds, 0 );
    // create AIG
    pNew = Gia_ManStart( Gia_ManObjNum(p) - Vec_IntSize(vAnds) + Gia_ManAndNum(pWin) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // inputs
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManConst0(pWin)->Value = 0;
    Gia_ManForEachCi( pWin, pObj, i )
        pObj->Value = Gia_ManObj(p, Vec_IntEntry(vPis, i))->Value;
    // internal nodes
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachAnd( pWin, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pWin, pObj, i )
        Gia_ManObj( p, Vec_IntEntry(vPos, i) )->Value = Gia_ObjFanin0Copy(pObj);
    Gia_ManForEachAnd( p, pObj, i )
        if ( !Gia_ObjIsTravIdCurrentId(p, i) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    // cleanup
    Vec_IntFree( vPis );
    Vec_IntFree( vPos );
    Vec_IntFree( vAnds );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}